

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall soplex::SPxMainSM<double>::SPxMainSM(SPxMainSM<double> *this,TYPE ttype)

{
  double *pdVar1;
  
  SPxSimplifier<double>::SPxSimplifier(&this->super_SPxSimplifier<double>,"MainSM",ttype);
  (this->super_SPxSimplifier<double>)._vptr_SPxSimplifier = (_func_int **)&PTR__SPxMainSM_0053e0b0;
  (this->m_prim).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_prim).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_prim).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_slack).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_slack).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_slack).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray(&this->m_cBasisStat,0,0,1.2);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray(&this->m_rBasisStat,0,0,1.2);
  DataArray<int>::DataArray(&this->m_cIdx,0,0,1.2);
  DataArray<int>::DataArray(&this->m_rIdx,0,0,1.2);
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::Array(&this->m_hist,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_classSetRows,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_classSetCols,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_dupRows,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_dupCols,0);
  this->m_postsolved = false;
  DataArray<int>::DataArray(&this->m_stat,0x10,0,1.2);
  this->m_thesense = MAXIMIZE;
  this->m_keepbounds = false;
  this->m_addedcols = 0;
  this->m_result = OKAY;
  pdVar1 = (double *)infinity();
  this->m_cutoffbound = -*pdVar1;
  pdVar1 = (double *)infinity();
  this->m_pseudoobj = -*pdVar1;
  return;
}

Assistant:

SPxMainSM(Timer::TYPE ttype = Timer::USER_TIME)
      : SPxSimplifier<R>("MainSM", ttype)
      , m_postsolved(0)
      , m_stat(16)
      , m_thesense(SPxLPBase<R>::MAXIMIZE)
      , m_keepbounds(false)
      , m_addedcols(0)
      , m_result(this->OKAY)
      , m_cutoffbound(R(-infinity))
      , m_pseudoobj(R(-infinity))
   {}